

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O3

void anon_unknown.dwarf_5f7ee::assert_not_in(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> v;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  Assert local_28;
  
  local_28.m_file = (char *)0x100000000;
  local_28.m_line = 2;
  local_28._12_4_ = 3;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,&local_49);
  local_28.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_28.m_line = 0x12e;
  UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>(&local_28,10,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(assert_not_in)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_NOT_IN(10, v);
        }
        catch (UnitTests::TestFailure&)
        {
            FAIL("ASSERT_NOT_IN should not have fired here.");
        }
    }